

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::VideoTrack::VideoPayloadSize(VideoTrack *this)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64_t uVar3;
  uint64 in_RDI;
  uint64_t size;
  uint64 in_stack_ffffffffffffffd8;
  uint64 value;
  Colour *this_00;
  undefined8 local_10;
  
  if (*(long *)(in_RDI + 0x90) == 0) {
    this_00 = *(Colour **)(in_RDI + 0xd8);
  }
  else {
    this_00 = *(Colour **)(in_RDI + 0x90);
  }
  uVar1 = EbmlElementSize((uint64)this_00,in_stack_ffffffffffffffd8);
  if (*(long *)(in_RDI + 0x88) == 0) {
    value = *(uint64 *)(in_RDI + 0xc0);
  }
  else {
    value = *(uint64 *)(in_RDI + 0x88);
  }
  uVar2 = EbmlElementSize((uint64)this_00,value);
  local_10 = uVar2 + uVar1;
  if (*(long *)(in_RDI + 0x80) != 0) {
    uVar1 = EbmlElementSize((uint64)this_00,value);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0x78) != 0) {
    uVar1 = EbmlElementSize((uint64)this_00,value);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0x98) != 0) {
    uVar1 = EbmlElementSize((uint64)this_00,value);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0xa0) != 0) {
    uVar1 = EbmlElementSize((uint64)this_00,value);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0xa8) != 0) {
    uVar1 = EbmlElementSize((uint64)this_00,value);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0xb0) != 0) {
    uVar1 = EbmlElementSize((uint64)this_00,value);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 200) != 0) {
    uVar1 = EbmlElementSize((uint64)this_00,value);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0xd0) != 0) {
    uVar1 = EbmlElementSize((uint64)this_00,value);
    local_10 = uVar1 + local_10;
  }
  if (0.0 < *(double *)(in_RDI + 0xb8)) {
    uVar1 = EbmlElementSize((uint64)this_00,(float)(value >> 0x20));
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0xe0) != 0) {
    uVar1 = EbmlElementSize(in_RDI,(char *)this_00);
    local_10 = uVar1 + local_10;
  }
  if (*(long *)(in_RDI + 0xe8) != 0) {
    uVar3 = Colour::ColourSize(this_00);
    local_10 = uVar3 + local_10;
  }
  if (*(long *)(in_RDI + 0xf0) != 0) {
    uVar3 = Projection::ProjectionSize((Projection *)this_00);
    local_10 = uVar3 + local_10;
  }
  return local_10;
}

Assistant:

uint64_t VideoTrack::VideoPayloadSize() const {
  uint64_t size = EbmlElementSize(
      libwebm::kMkvPixelWidth,
      static_cast<uint64>((pixel_width_ > 0) ? pixel_width_ : width_));
  size += EbmlElementSize(
      libwebm::kMkvPixelHeight,
      static_cast<uint64>((pixel_height_ > 0) ? pixel_height_ : height_));
  if (display_width_ > 0)
    size += EbmlElementSize(libwebm::kMkvDisplayWidth,
                            static_cast<uint64>(display_width_));
  if (display_height_ > 0)
    size += EbmlElementSize(libwebm::kMkvDisplayHeight,
                            static_cast<uint64>(display_height_));
  if (crop_left_ > 0)
    size += EbmlElementSize(libwebm::kMkvPixelCropLeft,
                            static_cast<uint64>(crop_left_));
  if (crop_right_ > 0)
    size += EbmlElementSize(libwebm::kMkvPixelCropRight,
                            static_cast<uint64>(crop_right_));
  if (crop_top_ > 0)
    size += EbmlElementSize(libwebm::kMkvPixelCropTop,
                            static_cast<uint64>(crop_top_));
  if (crop_bottom_ > 0)
    size += EbmlElementSize(libwebm::kMkvPixelCropBottom,
                            static_cast<uint64>(crop_bottom_));
  if (stereo_mode_ > kMono)
    size += EbmlElementSize(libwebm::kMkvStereoMode,
                            static_cast<uint64>(stereo_mode_));
  if (alpha_mode_ > kNoAlpha)
    size += EbmlElementSize(libwebm::kMkvAlphaMode,
                            static_cast<uint64>(alpha_mode_));
  if (frame_rate_ > 0.0)
    size += EbmlElementSize(libwebm::kMkvFrameRate,
                            static_cast<float>(frame_rate_));
  if (colour_space_)
    size += EbmlElementSize(libwebm::kMkvColourSpace, colour_space_);
  if (colour_)
    size += colour_->ColourSize();
  if (projection_)
    size += projection_->ProjectionSize();

  return size;
}